

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O2

float __thiscall
xray_re::xr_level_ai::vertex_plane_y(xr_level_ai *this,ai_node *node,float x,float z)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  fvector3 plane;
  anon_union_12_2_77b31271_for__vector3<float>_1 local_24;
  
  uVar4 = node->packed_xz;
  uVar5 = this->m_row_length;
  fVar1 = this->m_size;
  fVar2 = (this->m_aabb).field_0.field_1.x1;
  fVar3 = (this->m_aabb).field_0.field_1.z1;
  fVar6 = (float)node->packed_y * 1.5259022e-05 * this->m_size_y + (this->m_aabb).field_0.field_1.y1
  ;
  _vector3<float>::decompress((_vector3<float> *)&local_24.field_0,node->plane);
  fVar8 = SQRT(1.0 / (local_24.field_0.z * local_24.field_0.z +
                     local_24.field_0.x * local_24.field_0.x +
                     local_24.field_0.y * local_24.field_0.y));
  fVar7 = local_24.field_0.y * fVar8;
  if (1e-07 <= (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar7 |
                      (uint)(0.0 - fVar7) & -(uint)(fVar7 < 0.0))) {
    fVar6 = fVar6 - ((z * local_24.field_0.z * fVar8 +
                     fVar6 * fVar7 + x * local_24.field_0.x * fVar8) -
                    (((float)((ulong)uVar4 % (ulong)uVar5) * fVar1 + fVar3) *
                     local_24.field_0.z * fVar8 +
                    fVar6 * fVar7 +
                    ((float)((ulong)uVar4 / (ulong)uVar5) * fVar1 + fVar2) *
                    local_24.field_0.x * fVar8)) / fVar7;
  }
  return fVar6;
}

Assistant:

float xr_level_ai::vertex_plane_y(const ai_node& node, float x, float z) const
{
	float x0, z0, y0;
	unpack_xz(node.packed_xz, x0, z0);
	unpack_y(node.packed_y, y0);

	fvector3 plane;
	plane.decompress(node.plane);
	float m = std::sqrt(1.f/plane.square_magnitude()), ky = plane.y*m;
	if (equivalent(ky, 0.f, 1e-7f)) {
		return y0;
	} else {
		float kx = plane.x*m;
		float kz = plane.z*m;
		float v0 = kx*x0 + ky*y0 + kz*z0;
		return y0 - (kx*x + ky*y0 + kz*z - v0)/ky;
	}
}